

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O1

void PostCreate(ebml_master *Element,bool_t SetDefault,int ForProfile)

{
  void *pvVar1;
  
  if (ForProfile != 0) {
    pvVar1 = Node_InheritedVMT((node *)Element,0x544d4245);
    (**(code **)((long)pvVar1 + 0xb8))(Element,SetDefault,ForProfile);
    if (SetDefault != 0) {
      EBML_MasterAddMandatory(Element,SetDefault,ForProfile);
      (Element->Base).bValueIsSet = '\x01';
    }
    return;
  }
  __assert_fail("ForProfile != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                ,0x106,"void PostCreate(ebml_master *, bool_t, int)");
}

Assistant:

static void PostCreate(ebml_master *Element, bool_t SetDefault, int ForProfile)
{
    assert(ForProfile != 0);
    INHERITED(Element,ebml_element_vmt,EBML_MASTER_CLASS)->PostCreate(Element, SetDefault, ForProfile);
    if (SetDefault)
    {
	    EBML_MasterAddMandatory(Element, SetDefault, ForProfile);
        Element->Base.bValueIsSet = 1;
    }
}